

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::While(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
        *this)

{
  size_type t_match_start;
  byte bVar1;
  bool bVar2;
  eval_error *peVar3;
  element_type *peVar4;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d5;
  File_Position local_d4;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a5;
  File_Position local_a4;
  allocator<char> local_99;
  string local_98;
  undefined1 local_75;
  File_Position local_74;
  allocator<char> local_69;
  string local_68;
  Static_String local_38;
  size_type local_28;
  size_type prev_stack_top;
  bool retval;
  Depth_Counter dc;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser = this;
  Depth_Counter::Depth_Counter((Depth_Counter *)&stack0xffffffffffffffe8,this);
  prev_stack_top._7_1_ = 0;
  local_28 = std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
             ::size(&this->m_match_stack);
  utility::Static_String::Static_String<6ul>(&local_38,(char (*) [6])"while");
  bVar2 = Keyword(this,&local_38);
  if (bVar2) {
    prev_stack_top._7_1_ = 1;
    bVar2 = Char(this,'(');
    if (!bVar2) {
      local_75 = 1;
      peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Incomplete \'while\' expression",&local_69);
      File_Position::File_Position(&local_74,(this->m_position).line,(this->m_position).col);
      peVar4 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar3,&local_68,&local_74,peVar4);
      local_75 = 0;
      __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    bVar2 = Operator(this,0);
    if ((!bVar2) || (bVar2 = Char(this,')'), !bVar2)) {
      local_a5 = 1;
      peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Incomplete \'while\' expression",&local_99);
      File_Position::File_Position(&local_a4,(this->m_position).line,(this->m_position).col);
      peVar4 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar3,&local_98,&local_a4,peVar4);
      local_a5 = 0;
      __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    do {
      bVar2 = Eol(this);
    } while (bVar2);
    bVar2 = Block(this);
    t_match_start = local_28;
    if (!bVar2) {
      local_d5 = 1;
      peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"Incomplete \'while\' block",&local_c9);
      File_Position::File_Position(&local_d4,(this->m_position).line,(this->m_position).col);
      peVar4 = std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar3,&local_c8,&local_d4,peVar4);
      local_d5 = 0;
      __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
    ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::
    build_match<chaiscript::eval::While_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)this,t_match_start,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  bVar1 = prev_stack_top._7_1_;
  Depth_Counter::~Depth_Counter((Depth_Counter *)&stack0xffffffffffffffe8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool While() {
        Depth_Counter dc{this};
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("while")) {
          retval = true;

          if (!Char('(')) {
            throw exception::eval_error("Incomplete 'while' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          if (!(Operator() && Char(')'))) {
            throw exception::eval_error("Incomplete 'while' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          while (Eol()) {
          }

          if (!Block()) {
            throw exception::eval_error("Incomplete 'while' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::While_AST_Node<Tracer>>(prev_stack_top);
        }

        return retval;
      }